

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

char * flatbuffers::GenText(Parser *parser,void *flatbuffer,string *_text)

{
  Table *table;
  char *pcVar1;
  
  if (parser->root_struct_def_ == (StructDef *)0x0) {
    __assert_fail("parser.root_struct_def_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_text.cpp"
                  ,0x19c,
                  "const char *flatbuffers::GenText(const Parser &, const void *, std::string *)");
  }
  if ((parser->opts).size_prefixed == true) {
    flatbuffer = (void *)((long)flatbuffer + 4);
  }
  else if (flatbuffer == (void *)0x0) {
    table = (Table *)0x0;
    goto LAB_00146d85;
  }
  table = (Table *)((ulong)*flatbuffer + (long)flatbuffer);
LAB_00146d85:
  pcVar1 = GenerateTextImpl(parser,table,parser->root_struct_def_,_text);
  return pcVar1;
}

Assistant:

const char *GenText(const Parser &parser, const void *flatbuffer,
                    std::string *_text) {
  FLATBUFFERS_ASSERT(parser.root_struct_def_);  // call SetRootType()
  auto root = parser.opts.size_prefixed ? GetSizePrefixedRoot<Table>(flatbuffer)
                                        : GetRoot<Table>(flatbuffer);
  return GenerateTextImpl(parser, root, *parser.root_struct_def_, _text);
}